

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  Char CVar1;
  Type TVar2;
  code *pcVar3;
  bool bVar4;
  GroupInfo *pGVar5;
  undefined4 *puVar6;
  ResetGroupCont *this_00;
  GroupInfo *groupInfo;
  Char matchC;
  CharCount inputStartOffset;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *this_local;
  
  pGVar5 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  bVar4 = GroupInfo::IsUndefined(pGVar5);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xf30,"(matcher.GroupIdToGroupInfo(groupId)->IsUndefined())",
                       "matcher.GroupIdToGroupInfo(groupId)->IsUndefined()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  TVar2 = *inputOffset;
  CVar1 = (this->super_CharMixin).c;
  Matcher::CompStats(matcher);
  while( true ) {
    Matcher::CompStats(matcher);
    if ((inputLength <= *inputOffset) || (input[*inputOffset] != CVar1)) break;
    *inputOffset = *inputOffset + 1;
  }
  if (((this->super_NoNeedToSaveMixin).noNeedToSave & 1U) == 0) {
    this_00 = (ResetGroupCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::ResetGroupCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    ResetGroupCont::ResetGroupCont(this_00,(this->super_GroupMixin).groupId);
    Matcher::PushStats(matcher,contStack,input);
  }
  pGVar5 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  pGVar5->offset = TVar2;
  pGVar5->length = *inputOffset - TVar2;
  *instPointer = *instPointer + 8;
  return false;
}

Assistant:

inline bool ChompCharGroupInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(matcher.GroupIdToGroupInfo(groupId)->IsUndefined());

        const CharCount inputStartOffset = inputOffset;
        const Char matchC = c;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if(Mode == ChompMode::Star || (inputOffset < inputLength && input[inputOffset] == matchC))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && input[inputOffset] == matchC)
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            if (!noNeedToSave)
            {
                // UNDO ACTION: Restore group on backtrack
                PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }

            GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
            groupInfo->offset = inputStartOffset;
            groupInfo->length = inputOffset - inputStartOffset;

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }